

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O1

string * __thiscall
wabt::(anonymous_namespace)::TypesToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,TypeVector *types,char *prefix
          )

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  ulong uVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"[","");
  if (types != (TypeVector *)0x0) {
    std::__cxx11::string::append((string *)__return_storage_ptr__,(char *)types);
  }
  lVar2 = *(long *)this;
  if (*(long *)(this + 8) != lVar2) {
    uVar4 = 0;
    do {
      iVar1 = *(int *)(lVar2 + uVar4 * 4);
      if (iVar1 < -0x10) {
        if (iVar1 == -0x40) {
          pcVar3 = "void";
        }
        else if (iVar1 == -0x20) {
          pcVar3 = "func";
        }
        else {
          if (iVar1 != -0x18) goto switchD_00f66c7e_caseD_fffffff1;
          pcVar3 = "except_ref";
        }
      }
      else {
        pcVar3 = "i32";
        switch(iVar1) {
        case 0:
          pcVar3 = "any";
          break;
        case -0x10:
          pcVar3 = "anyfunc";
          break;
        default:
switchD_00f66c7e_caseD_fffffff1:
          pcVar3 = "<type index>";
          break;
        case -5:
          pcVar3 = "v128";
          break;
        case -4:
          pcVar3 = "f64";
          break;
        case -3:
          pcVar3 = "f32";
          break;
        case -2:
          pcVar3 = "i64";
          break;
        case -1:
          break;
        }
      }
      std::__cxx11::string::append((string *)__return_storage_ptr__,pcVar3);
      if (uVar4 < (*(long *)(this + 8) - *(long *)this >> 2) - 1U) {
        std::__cxx11::string::append((string *)__return_storage_ptr__,", ");
      }
      uVar4 = uVar4 + 1;
      lVar2 = *(long *)this;
    } while (uVar4 < (ulong)(*(long *)(this + 8) - lVar2 >> 2));
  }
  std::__cxx11::string::append((string *)__return_storage_ptr__,"]");
  return __return_storage_ptr__;
}

Assistant:

std::string TypesToString(const TypeVector& types,
                          const char* prefix = nullptr) {
  std::string result = "[";
  if (prefix) {
    result += prefix;
  }

  for (size_t i = 0; i < types.size(); ++i) {
    result += GetTypeName(types[i]);
    if (i < types.size() - 1) {
      result += ", ";
    }
  }
  result += "]";
  return result;
}